

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  PolicyID id_05;
  PolicyID id_06;
  bool local_c3a;
  bool local_bda;
  bool local_b4a;
  bool local_aea;
  string local_ac0;
  string_view local_aa0;
  string *local_a90;
  string *actual;
  undefined1 local_a68 [8];
  string emulatedId;
  undefined1 local_a28 [8];
  string emulated;
  undefined1 local_9e8 [8];
  string version;
  allocator<char> local_9b1;
  string local_9b0;
  string_view local_990;
  allocator<char> local_979;
  string local_978;
  string_view local_958;
  allocator<char> local_941;
  string local_940;
  string_view local_920;
  string local_910;
  string local_8f0;
  undefined1 local_8d0 [8];
  ostringstream w_3;
  allocator<char> local_751;
  string local_750;
  string local_730;
  string_view local_710;
  string local_700;
  string local_6e0;
  undefined1 local_6c0 [8];
  ostringstream w_2;
  allocator<char> local_541;
  string local_540;
  string local_520;
  string_view local_500;
  allocator<char> local_4e9;
  string local_4e8;
  string_view local_4c8;
  allocator<char> local_4b1;
  string local_4b0;
  string_view local_490;
  string local_480;
  string local_460;
  undefined1 local_440 [8];
  ostringstream w_1;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  string_view local_280;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream w;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string compilerId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string compilerIdVar;
  string *lang_local;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  compilerIdVar.field_2._8_8_ = lang;
  std::operator+(&local_60,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"_COMPILER_ID");
  std::__cxx11::string::~string((string *)&local_60);
  psVar3 = cmMakefile::GetSafeDefinition(mf,(string *)local_40);
  std::__cxx11::string::string((string *)local_90,(string *)psVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"AppleClang");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_aea = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"CMAKE_POLICY_WARNING_CMP0025",&local_b1);
        local_aea = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      if (local_aea != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x19,id_00);
        poVar4 = std::operator<<((ostream *)local_230,(string *)&local_250);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)compilerIdVar.field_2._8_8_);
        std::operator<<(poVar4," compiler id \"AppleClang\" to \"Clang\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_280,"Clang");
      cmMakefile::AddDefinition(mf,(string *)local_40,local_280);
      break;
    case NEW:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_2a0,(cmPolicies *)0x19,id);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"QCC");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_b4a = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"CMAKE_POLICY_WARNING_CMP0047",&local_2c1);
        local_b4a = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
      }
      if (local_b4a != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_460,(cmPolicies *)0x2f,id_02);
        poVar4 = std::operator<<((ostream *)local_440,(string *)&local_460);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)compilerIdVar.field_2._8_8_);
        std::operator<<(poVar4," compiler id \"QCC\" to \"GNU\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_490,"GNU");
      cmMakefile::AddDefinition(mf,(string *)local_40,local_490);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              compilerIdVar.field_2._8_8_,"C");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,"CMAKE_COMPILER_IS_GNUCC",&local_4b1);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4c8,"1");
        cmMakefile::AddDefinition(mf,&local_4b0,local_4c8);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator(&local_4b1);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )compilerIdVar.field_2._8_8_,"CXX");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,"CMAKE_COMPILER_IS_GNUCXX",&local_4e9);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_500,"1");
          cmMakefile::AddDefinition(mf,&local_4e8,local_500);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::allocator<char>::~allocator(&local_4e9);
        }
      }
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_520,(cmPolicies *)0x2f,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
    case NEW:
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"XLClang");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_bda = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_540,"CMAKE_POLICY_WARNING_CMP0089",&local_541);
        local_bda = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_540);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
      }
      if (local_bda != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_6e0,(cmPolicies *)0x59,id_04);
        poVar4 = std::operator<<((ostream *)local_6c0,(string *)&local_6e0);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)compilerIdVar.field_2._8_8_);
        std::operator<<(poVar4," compiler id \"XLClang\" to \"XL\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_6e0);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_700);
        std::__cxx11::string::~string((string *)&local_700);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_710,"XL");
      cmMakefile::AddDefinition(mf,(string *)local_40,local_710);
      break;
    case NEW:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_730,(cmPolicies *)0x59,id_03);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"LCC");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0129,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_c3a = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"CMAKE_POLICY_WARNING_CMP0129",&local_751);
        local_c3a = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_750);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator(&local_751);
      }
      if (local_c3a != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_8f0,(cmPolicies *)0x81,id_06);
        poVar4 = std::operator<<((ostream *)local_8d0,(string *)&local_8f0);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)compilerIdVar.field_2._8_8_);
        std::operator<<(poVar4," compiler id \"LCC\" to \"GNU\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_8f0);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_910);
        std::__cxx11::string::~string((string *)&local_910);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d0);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_920,"GNU");
      cmMakefile::AddDefinition(mf,(string *)local_40,local_920);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              compilerIdVar.field_2._8_8_,"C");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_940,"CMAKE_COMPILER_IS_GNUCC",&local_941);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_958,"1");
        cmMakefile::AddDefinition(mf,&local_940,local_958);
        std::__cxx11::string::~string((string *)&local_940);
        std::allocator<char>::~allocator(&local_941);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )compilerIdVar.field_2._8_8_,"CXX");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_978,"CMAKE_COMPILER_IS_GNUCXX",&local_979);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_990,"1");
          cmMakefile::AddDefinition(mf,&local_978,local_990);
          std::__cxx11::string::~string((string *)&local_978);
          std::allocator<char>::~allocator(&local_979);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)compilerIdVar.field_2._8_8_,"Fortran");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_9b0,"CMAKE_COMPILER_IS_GNUG77",&local_9b1);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&version.field_2 + 8),"1");
            cmMakefile::AddDefinition(mf,&local_9b0,stack0xfffffffffffff638);
            std::__cxx11::string::~string((string *)&local_9b0);
            std::allocator<char>::~allocator(&local_9b1);
          }
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&emulated.field_2 + 8),"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     compilerIdVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&emulated.field_2 + 8),"_COMPILER_VERSION");
      std::__cxx11::string::~string((string *)(emulated.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&emulatedId.field_2 + 8),"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     compilerIdVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&emulatedId.field_2 + 8),"_SIMULATE_VERSION");
      std::__cxx11::string::~string((string *)(emulatedId.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&actual,
                     "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              compilerIdVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&actual,
                     "_SIMULATE_ID");
      std::__cxx11::string::~string((string *)&actual);
      local_a90 = cmMakefile::GetRequiredDefinition(mf,(string *)local_a28);
      local_aa0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a90);
      cmMakefile::AddDefinition(mf,(string *)local_9e8,local_aa0);
      cmMakefile::RemoveDefinition(mf,(string *)local_a68);
      cmMakefile::RemoveDefinition(mf,(string *)local_a28);
      std::__cxx11::string::~string((string *)local_a68);
      std::__cxx11::string::~string((string *)local_a28);
      std::__cxx11::string::~string((string *)local_9e8);
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_ac0,(cmPolicies *)0x81,id_05);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_ac0);
      std::__cxx11::string::~string((string *)&local_ac0);
    case NEW:
    }
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = "CMAKE_" + lang + "_COMPILER_ID";
  std::string const compilerId = mf->GetSafeDefinition(compilerIdVar);

  if (compilerId == "AppleClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            R"( compiler id "AppleClang" to "Clang" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "QCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            R"( compiler id "QCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (compilerId == "XLClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            R"( compiler id "XLClang" to "XL" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "LCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0129)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0129")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0129) << "\n"
            "Converting " << lang <<
            R"( compiler id "LCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert LCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        } else if (lang == "Fortran") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUG77", "1");
        }
        {
          // Fix compiler versions.
          std::string version = "CMAKE_" + lang + "_COMPILER_VERSION";
          std::string emulated = "CMAKE_" + lang + "_SIMULATE_VERSION";
          std::string emulatedId = "CMAKE_" + lang + "_SIMULATE_ID";
          std::string const& actual = mf->GetRequiredDefinition(emulated);
          mf->AddDefinition(version, actual);
          mf->RemoveDefinition(emulatedId);
          mf->RemoveDefinition(emulated);
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0129));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep LCC.
        break;
    }
  }
}